

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_subarray
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  vm_obj_id_t obj;
  ulong uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  vm_val_t *this_00;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjByteArray *arr;
  unsigned_long cnt;
  unsigned_long idx;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  int in_root_set;
  vm_val_t *in_stack_ffffffffffffff88;
  uint local_64;
  ulong uVar5;
  CVmObjByteArray *in_stack_ffffffffffffffc0;
  unsigned_long in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (in_RCX == (uint *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = *in_RCX;
  }
  if ((getp_subarray(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_subarray(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_subarray::desc,1,1);
    __cxa_guard_release(&getp_subarray(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  in_root_set = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    uVar2 = (ulong)iVar1;
    if (uVar2 == 0) {
      uVar5 = 1;
    }
    else {
      uVar5 = uVar2;
      uVar3 = get_element_count((CVmObjByteArray *)0x2c3121);
      if (uVar3 + 1 < uVar2) {
        uVar3 = get_element_count((CVmObjByteArray *)0x2c313c);
        uVar5 = uVar3 + 1;
      }
    }
    if (local_64 < 2) {
      uVar3 = get_element_count((CVmObjByteArray *)0x2c3166);
    }
    else {
      iVar1 = CVmBif::pop_int_val();
      uVar3 = (unsigned_long)iVar1;
    }
    uVar2 = uVar5;
    uVar4 = get_element_count((CVmObjByteArray *)0x2c317f);
    if (uVar4 < uVar5) {
      uVar3 = 0;
    }
    else {
      uVar5 = (uVar2 + uVar3) - 1;
      uVar4 = get_element_count((CVmObjByteArray *)0x2c31b4);
      if (uVar4 < uVar5) {
        uVar3 = get_element_count((CVmObjByteArray *)0x2c31cb);
        uVar3 = (uVar3 + 1) - uVar2;
      }
      in_root_set = (int)(uVar5 >> 0x20);
    }
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    obj = create(in_root_set,(unsigned_long)in_RDX);
    vm_val_t::set_obj(in_RDX,obj);
    vm_objp(0);
    copy_from((CVmObjByteArray *)CONCAT44(local_64,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,uVar2,uVar3);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_subarray(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *in_argc)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    unsigned long idx;
    unsigned long cnt;
    CVmObjByteArray *arr;
    
    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the starting index */
    idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be in range */
    if (idx < 1)
        idx = 1;
    else if (idx > get_element_count() + 1)
        idx = get_element_count() + 1;

    /* if there's a count, get it */
    if (argc >= 2)
    {
        /* get the explicit count */
        cnt = CVmBif::pop_int_val(vmg0_);
    }
    else
    {
        /* use the entire rest of the array */
        cnt = get_element_count();
    }

    /* limit the count to the available size */
    if (idx > get_element_count())
        cnt = 0;
    else if (idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - idx;

    /* push a self-reference while we're working for gc protection */
    G_stk->push()->set_obj(self);

    /* allocate a new array to hold the result */
    retval->set_obj(create(vmg_ FALSE, cnt));
    arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

    /* copy the data from our array into the new one */
    arr->copy_from(1, this, idx, cnt);

    /* discard our self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}